

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmv.c
# Opt level: O3

void XMVFrameSpec_Init(XMVFrameSpec *spec)

{
  spec->marker = 0;
  spec->xpkentry = 0;
  spec->a = 0;
  spec->b = 0;
  spec->c = 0;
  spec->d = 0;
  spec->e = 0;
  spec->f = 0;
  return;
}

Assistant:

void
XMVFrameSpec_Init(XMVFrameSpec *spec)
{
	spec->marker = 0;
	spec->xpkentry = 0;
	spec->a = 0;
	spec->b = 0;
	spec->c = 0;
	spec->d = 0;
	spec->e = 0;
	spec->f = 0;
}